

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void Acb_CollectIntNodes(Gia_Man_t *p,Vec_Int_t *vNodes0,Vec_Int_t *vNodes1)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  
  vNodes0->nSize = 0;
  vNodes1->nSize = 0;
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  iVar2 = 0;
  while ((iVar2 < p->vCis->nSize && (pGVar1 = Gia_ManCi(p,iVar2), pGVar1 != (Gia_Obj_t *)0x0))) {
    Gia_ObjSetTravIdCurrent(p,pGVar1);
    iVar2 = iVar2 + 1;
  }
  iVar2 = 0;
  while ((iVar2 < p->vCos->nSize && (pGVar1 = Gia_ManCo(p,iVar2), pGVar1 != (Gia_Obj_t *)0x0))) {
    if (iVar2 != 0) {
      Acb_CollectIntNodes_rec(p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),vNodes1)
      ;
    }
    iVar2 = iVar2 + 1;
  }
  iVar2 = 0;
  while( true ) {
    if (p->vCos->nSize <= iVar2) {
      return;
    }
    pGVar1 = Gia_ManCo(p,iVar2);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    if (iVar2 == 0) {
      Acb_CollectIntNodes_rec(p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),vNodes0)
      ;
    }
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void Acb_CollectIntNodes( Gia_Man_t * p, Vec_Int_t * vNodes0, Vec_Int_t * vNodes1 )
{
    Gia_Obj_t * pObj; int i;
    Vec_IntClear( vNodes0 );
    Vec_IntClear( vNodes1 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachCi( p, pObj, i )
        Gia_ObjSetTravIdCurrent( p, pObj );
    Gia_ManForEachCo( p, pObj, i )
        if ( i > 0 )
            Acb_CollectIntNodes_rec( p, Gia_ObjFanin0(pObj), vNodes1 );
    Gia_ManForEachCo( p, pObj, i )
        if ( i == 0 )
            Acb_CollectIntNodes_rec( p, Gia_ObjFanin0(pObj), vNodes0 );
}